

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O0

int QGregorianCalendar::monthLength(int month,int year)

{
  bool bVar1;
  int in_ESI;
  uint in_EDI;
  undefined4 local_4;
  
  if (((int)in_EDI < 1) || (0xc < (int)in_EDI)) {
    local_4 = 0;
  }
  else if (in_EDI == 2) {
    bVar1 = leapTest(in_ESI);
    local_4 = 0x1c;
    if (bVar1) {
      local_4 = 0x1d;
    }
  }
  else {
    local_4 = in_EDI & 1 ^ (int)in_EDI >> 3 | 0x1e;
  }
  return local_4;
}

Assistant:

int QGregorianCalendar::monthLength(int month, int year)
{
    if (month < 1 || month > 12)
        return 0;

    if (month == 2)
        return leapTest(year) ? 29 : 28;

    return 30 | ((month & 1) ^ (month >> 3));
}